

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel2
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  cmExpandedCommandArgument *argument;
  cmExpandedCommandArgument *argument_00;
  CompareOp op;
  _List_node_base *p_Var1;
  iterator iVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  CurrentAndTwoMoreIter args;
  CurrentAndTwoMoreIter args_00;
  CurrentAndTwoMoreIter args_01;
  CurrentAndTwoMoreIter args_02;
  CurrentAndTwoMoreIter args_03;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  iterator iVar15;
  bool bVar16;
  bool value;
  int iVar17;
  int iVar18;
  cmValue cVar19;
  string *psVar20;
  cmValue cVar21;
  ostream *poVar22;
  string *f2;
  Status SVar23;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var24;
  long lVar25;
  PolicyID id;
  PolicyID id_00;
  _List_node_base *p_Var26;
  basic_string_view<char,_std::char_traits<char>_> __str;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view keyword_08;
  static_string_view keyword_09;
  static_string_view keyword_10;
  static_string_view keyword_11;
  static_string_view keyword_12;
  static_string_view keyword_13;
  static_string_view keyword_14;
  static_string_view keyword_15;
  static_string_view keyword_16;
  static_string_view keyword_17;
  static_string_view keyword_18;
  string_view arg;
  string def_buf;
  RegularExpression regEntry;
  ostringstream error;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string *local_380;
  MessageType *local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  undefined1 local_358 [176];
  char *local_2a8;
  char *local_298;
  int local_290;
  _List_node_base *local_288;
  _List_node_base *p_Stack_280;
  _List_node_base *local_278;
  _List_node_base *local_270;
  _List_node_base *p_Stack_268;
  _List_node_base *local_260;
  _List_node_base *local_258;
  _List_node_base *p_Stack_250;
  _List_node_base *local_248;
  _List_node_base *local_240;
  _List_node_base *p_Stack_238;
  _List_node_base *local_230;
  _List_node_base *local_228;
  _List_node_base *p_Stack_220;
  _List_node_base *local_218;
  _List_node_base *local_210;
  _List_node_base *p_Stack_208;
  _List_node_base *local_200;
  _List_node_base *local_1f8;
  _List_node_base *p_Stack_1f0;
  _List_node_base *local_1e8;
  _List_node_base *local_1e0;
  _List_node_base *p_Stack_1d8;
  _List_node_base *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var1 = (newArgs->
           super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
           super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var26 = p_Var1;
  if (p_Var1 != (_List_node_base *)newArgs) {
    p_Var26 = p_Var1->_M_next;
  }
  local_380 = errorString;
  local_378 = status;
  iVar2._M_node = p_Var26;
  if (p_Var26 != (_List_node_base *)newArgs) {
    iVar2._M_node = p_Var26->_M_next;
  }
  do {
    if (p_Var1 == (_List_node_base *)newArgs) {
      return true;
    }
    if (p_Var26 != (_List_node_base *)newArgs) {
      argument_00 = (cmExpandedCommandArgument *)(p_Var1 + 1);
      keyword.super_string_view._M_str = DAT_009669c0;
      keyword.super_string_view._M_len = (anonymous_namespace)::keyMATCHES;
      bVar16 = IsKeyword(this,keyword,argument_00);
      if (bVar16) {
        args.next._M_node = p_Var26;
        args.current._M_node = p_Var1;
        args.nextnext._M_node = iVar2._M_node;
        local_1e0 = p_Var1;
        p_Stack_1d8 = p_Var26;
        local_1d0 = iVar2._M_node;
        cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
                  (newArgs,false,args);
      }
      else if (iVar2._M_node != (_List_node_base *)newArgs) {
        argument = (cmExpandedCommandArgument *)(p_Var26 + 1);
        keyword_00.super_string_view._M_str = DAT_009669c0;
        keyword_00.super_string_view._M_len = (anonymous_namespace)::keyMATCHES;
        bVar16 = IsKeyword(this,keyword_00,argument);
        pcVar12 = DAT_009669b0;
        sVar11 = (anonymous_namespace)::keyLESS_EQUAL;
        pcVar10 = DAT_00966940;
        sVar9 = (anonymous_namespace)::keyGREATER_EQUAL;
        pcVar8 = DAT_00966930;
        sVar7 = (anonymous_namespace)::keyGREATER;
        pcVar6 = DAT_00966910;
        sVar5 = (anonymous_namespace)::keyEQUAL;
        if (bVar16) {
          cVar19 = GetDefinitionIfUnquoted(this,argument_00);
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          local_3e0._M_string_length = 0;
          local_3e0.field_2._M_local_buf[0] = '\0';
          if (cVar19.Value == (string *)0x0) {
            cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
          }
          else {
            psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
            local_1a8._8_8_ = (psVar20->_M_dataplus)._M_p;
            local_1a8._0_8_ = psVar20->_M_string_length;
            __str._M_str = "CMAKE_MATCH_";
            __str._M_len = 0xc;
            iVar17 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)local_1a8,0,0xc,
                                __str);
            if (iVar17 == 0) {
              cVar19.Value = &local_3e0;
              std::__cxx11::string::_M_assign((string *)cVar19.Value);
            }
          }
          cmMakefile::ClearMatches(this->Makefile);
          psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                              ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
          local_2a8 = (char *)0x0;
          local_298 = (char *)0x0;
          local_290 = 0;
          memset((RegularExpression *)local_358,0,0xaa);
          bVar16 = cmsys::RegularExpression::compile
                             ((RegularExpression *)local_358,(psVar20->_M_dataplus)._M_p);
          if (bVar16) {
            value = cmsys::RegularExpression::find
                              ((RegularExpression *)local_358,((cVar19.Value)->_M_dataplus)._M_p,
                               (RegularExpressionMatch *)local_358);
            if (value) {
              cmMakefile::StoreMatches(this->Makefile,(RegularExpression *)local_358);
            }
            args_00.next._M_node = p_Var26;
            args_00.current._M_node = p_Var1;
            args_00.nextnext._M_node = iVar2._M_node;
            local_270 = p_Var1;
            p_Stack_268 = p_Var26;
            local_260 = iVar2._M_node;
            cmArgumentList::ReduceTwoArgs(newArgs,value,args_00);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Regular expression \"",0x14);
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(psVar20->_M_dataplus)._M_p,
                                 psVar20->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\" cannot compile",0x10);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)local_380,(string *)local_1c8);
            if (local_1c8[0] != local_1b8) {
              operator_delete(local_1c8[0],local_1b8[0] + 1);
            }
            *local_378 = FATAL_ERROR;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          if (local_298 != (char *)0x0) {
            operator_delete__(local_298);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,
                            CONCAT71(local_3e0.field_2._M_allocated_capacity._1_7_,
                                     local_3e0.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar16) {
            return false;
          }
        }
        else {
          keyword_01.super_string_view._M_str = DAT_009669a0;
          keyword_01.super_string_view._M_len = (anonymous_namespace)::keyLESS;
          bVar16 = IsKeyword(this,keyword_01,argument);
          iVar17 = 1;
          if (bVar16) {
LAB_0052a987:
            cVar19 = GetDefinitionIfUnquoted(this,argument_00);
            if (cVar19.Value == (string *)0x0) {
              cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
            }
            cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
            if (cVar21.Value == (string *)0x0) {
              cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                       ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
            }
            bVar16 = false;
            iVar18 = __isoc99_sscanf(((cVar19.Value)->_M_dataplus)._M_p,"%lg",local_1a8);
            p_Var13 = p_Var1;
            p_Var14 = p_Var26;
            iVar15._M_node = iVar2._M_node;
            if (iVar18 == 1) {
              bVar16 = false;
              iVar18 = __isoc99_sscanf(((cVar21.Value)->_M_dataplus)._M_p,"%lg",local_358);
              if (iVar18 == 1) {
                if (iVar17 == 3) {
                  bVar16 = (double)local_1a8._0_8_ < (double)local_358._0_8_;
LAB_0052ac4b:
                  bVar16 = !bVar16 && (double)local_358._0_8_ != (double)local_1a8._0_8_;
                }
                else {
                  if (iVar17 == 2) {
                    bVar16 = (double)local_358._0_8_ < (double)local_1a8._0_8_;
                  }
                  else {
                    if (iVar17 == 1) {
                      bVar16 = (double)local_358._0_8_ < (double)local_1a8._0_8_;
                      goto LAB_0052ac4b;
                    }
                    if (iVar17 != 4) {
                      bVar16 = (double)local_1a8._0_8_ == (double)local_358._0_8_ && iVar17 == 5;
                      goto LAB_0052ae26;
                    }
                    bVar16 = (double)local_1a8._0_8_ < (double)local_358._0_8_;
                  }
                  bVar16 = !bVar16;
                }
              }
            }
          }
          else {
            keyword_02.super_string_view._M_str = pcVar12;
            keyword_02.super_string_view._M_len = sVar11;
            bVar16 = IsKeyword(this,keyword_02,argument);
            iVar17 = 2;
            if (bVar16) goto LAB_0052a987;
            keyword_03.super_string_view._M_str = pcVar8;
            keyword_03.super_string_view._M_len = sVar7;
            bVar16 = IsKeyword(this,keyword_03,argument);
            iVar17 = 3;
            if (bVar16) goto LAB_0052a987;
            keyword_04.super_string_view._M_str = pcVar10;
            keyword_04.super_string_view._M_len = sVar9;
            bVar16 = IsKeyword(this,keyword_04,argument);
            iVar17 = 4;
            if (bVar16) goto LAB_0052a987;
            keyword_05.super_string_view._M_str = pcVar6;
            keyword_05.super_string_view._M_len = sVar5;
            bVar16 = IsKeyword(this,keyword_05,argument);
            pcVar12 = DAT_00966a60;
            sVar11 = (anonymous_namespace)::keySTRLESS_EQUAL;
            pcVar10 = DAT_00966a40;
            sVar9 = (anonymous_namespace)::keySTRGREATER_EQUAL;
            pcVar8 = DAT_00966a30;
            sVar7 = (anonymous_namespace)::keySTRGREATER;
            pcVar6 = DAT_00966a20;
            sVar5 = (anonymous_namespace)::keySTREQUAL;
            iVar17 = 5;
            if (bVar16) goto LAB_0052a987;
            keyword_06.super_string_view._M_str = DAT_00966a50;
            keyword_06.super_string_view._M_len = (anonymous_namespace)::keySTRLESS;
            bVar16 = IsKeyword(this,keyword_06,argument);
            iVar17 = 1;
            if (!bVar16) {
              keyword_07.super_string_view._M_str = pcVar12;
              keyword_07.super_string_view._M_len = sVar11;
              bVar16 = IsKeyword(this,keyword_07,argument);
              iVar17 = 2;
              if (!bVar16) {
                keyword_08.super_string_view._M_str = pcVar8;
                keyword_08.super_string_view._M_len = sVar7;
                bVar16 = IsKeyword(this,keyword_08,argument);
                iVar17 = 3;
                if (!bVar16) {
                  keyword_09.super_string_view._M_str = pcVar10;
                  keyword_09.super_string_view._M_len = sVar9;
                  bVar16 = IsKeyword(this,keyword_09,argument);
                  iVar17 = 4;
                  if (!bVar16) {
                    keyword_10.super_string_view._M_str = pcVar6;
                    keyword_10.super_string_view._M_len = sVar5;
                    bVar16 = IsKeyword(this,keyword_10,argument);
                    pcVar12 = DAT_00966ad0;
                    sVar11 = (anonymous_namespace)::keyVERSION_LESS_EQUAL;
                    pcVar10 = DAT_00966ab0;
                    sVar9 = (anonymous_namespace)::keyVERSION_GREATER_EQUAL;
                    pcVar8 = DAT_00966aa0;
                    sVar7 = (anonymous_namespace)::keyVERSION_GREATER;
                    pcVar6 = DAT_00966a90;
                    sVar5 = (anonymous_namespace)::keyVERSION_EQUAL;
                    iVar17 = 5;
                    if (!bVar16) {
                      keyword_11.super_string_view._M_str = DAT_00966ac0;
                      keyword_11.super_string_view._M_len = (anonymous_namespace)::keyVERSION_LESS;
                      bVar16 = IsKeyword(this,keyword_11,argument);
                      if (bVar16) {
                        lVar25 = 0;
LAB_0052afb6:
                        op = (&(anonymous_namespace)::MATCH2CMPOP)[lVar25];
                        cVar19 = GetDefinitionIfUnquoted(this,argument_00);
                        if (cVar19.Value == (string *)0x0) {
                          cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00)
                          ;
                        }
                        cVar21 = GetDefinitionIfUnquoted
                                           (this,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
                        if (cVar21.Value == (string *)0x0) {
                          cVar21.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                                   ((cmExpandedCommandArgument *)(iVar2._M_node + 1)
                                                   );
                        }
                        bVar16 = cmSystemTools::VersionCompare(op,cVar19.Value,cVar21.Value);
                        local_228 = p_Var1;
                        p_Stack_220 = p_Var26;
                        local_218 = iVar2._M_node;
                      }
                      else {
                        keyword_12.super_string_view._M_str = pcVar12;
                        keyword_12.super_string_view._M_len = sVar11;
                        bVar16 = IsKeyword(this,keyword_12,argument);
                        lVar25 = 1;
                        if (bVar16) goto LAB_0052afb6;
                        keyword_13.super_string_view._M_str = pcVar8;
                        keyword_13.super_string_view._M_len = sVar7;
                        bVar16 = IsKeyword(this,keyword_13,argument);
                        lVar25 = 2;
                        if (bVar16) goto LAB_0052afb6;
                        keyword_14.super_string_view._M_str = pcVar10;
                        keyword_14.super_string_view._M_len = sVar9;
                        bVar16 = IsKeyword(this,keyword_14,argument);
                        lVar25 = 3;
                        if (bVar16) goto LAB_0052afb6;
                        keyword_15.super_string_view._M_str = pcVar6;
                        keyword_15.super_string_view._M_len = sVar5;
                        bVar16 = IsKeyword(this,keyword_15,argument);
                        lVar25 = 4;
                        if (bVar16) goto LAB_0052afb6;
                        keyword_16.super_string_view._M_str = DAT_00966980;
                        keyword_16.super_string_view._M_len =
                             (anonymous_namespace)::keyIS_NEWER_THAN;
                        bVar16 = IsKeyword(this,keyword_16,argument);
                        if (!bVar16) {
                          keyword_17.super_string_view._M_str = DAT_00966950;
                          keyword_17.super_string_view._M_len = (anonymous_namespace)::keyIN_LIST;
                          bVar16 = IsKeyword(this,keyword_17,argument);
                          if (bVar16) {
                            if (this->Policy57Status < NEW) {
                              if (this->Policy57Status == WARN) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1a8);
                                cmPolicies::GetPolicyWarning_abi_cxx11_
                                          ((string *)local_358,(cmPolicies *)0x39,id);
                                poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_1a8,(char *)local_358._0_8_,
                                                     local_358._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar22,
                                           "\nIN_LIST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                           ,0x86);
                                if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
                                  operator_delete((void *)local_358._0_8_,
                                                  (ulong)(local_358._16_8_ + 1));
                                }
                                pcVar3 = this->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_358);
LAB_0052b2d3:
                                if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
                                  operator_delete((void *)local_358._0_8_,
                                                  (ulong)(local_358._16_8_ + 1));
                                }
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_1a8);
                                std::ios_base::~ios_base(local_138);
                              }
                            }
                            else {
                              cVar19 = GetVariableOrString(this,argument_00);
                              pcVar3 = this->Makefile;
                              psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                                  ((cmExpandedCommandArgument *)(iVar2._M_node + 1))
                              ;
                              cVar21 = cmMakefile::GetDefinition(pcVar3,psVar20);
                              if (cVar21.Value == (string *)0x0) {
                                bVar16 = false;
                              }
                              else {
                                arg._M_str = ((cVar21.Value)->_M_dataplus)._M_p;
                                arg._M_len = (cVar21.Value)->_M_string_length;
                                cmExpandedList_abi_cxx11_(&local_370,arg,true);
                                _Var24 = std::
                                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                                   (local_370.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  local_370.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish,
                                                  cVar19.Value);
                                bVar16 = _Var24._M_current !=
                                         local_370.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                              }
                              args_03.next._M_node = p_Var26;
                              args_03.current._M_node = p_Var1;
                              args_03.nextnext._M_node = iVar2._M_node;
                              local_288 = p_Var1;
                              p_Stack_280 = p_Var26;
                              local_278 = iVar2._M_node;
                              cmArgumentList::ReduceTwoArgs(newArgs,bVar16,args_03);
                              if (cVar21.Value != (string *)0x0) {
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector(&local_370);
                              }
                            }
                          }
                          else {
                            keyword_18.super_string_view._M_str = DAT_00966ae0;
                            keyword_18.super_string_view._M_len =
                                 (anonymous_namespace)::keyPATH_EQUAL;
                            bVar16 = IsKeyword(this,keyword_18,argument);
                            if (bVar16) {
                              if (WARN < this->Policy139Status) {
                                cVar19 = GetVariableOrString(this,argument_00);
                                cVar21 = GetVariableOrString(this,(cmExpandedCommandArgument *)
                                                                  (iVar2._M_node + 1));
                                local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
                                pcVar4 = ((cVar19.Value)->_M_dataplus)._M_p;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_3a0,pcVar4,
                                           pcVar4 + (cVar19.Value)->_M_string_length);
                                cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                          ((cmCMakePath *)local_1a8,&local_3a0,generic_format);
                                local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
                                pcVar4 = ((cVar21.Value)->_M_dataplus)._M_p;
                                std::__cxx11::string::_M_construct<char*>
                                          ((string *)&local_3c0,pcVar4,
                                           pcVar4 + (cVar21.Value)->_M_string_length);
                                cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                                          ((cmCMakePath *)local_358,&local_3c0,generic_format);
                                iVar17 = std::filesystem::__cxx11::path::compare((path *)local_1a8);
                                std::filesystem::__cxx11::path::~path((path *)local_358);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
                                  operator_delete(local_3c0._M_dataplus._M_p,
                                                  local_3c0.field_2._M_allocated_capacity + 1);
                                }
                                std::filesystem::__cxx11::path::~path((path *)local_1a8);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
                                  operator_delete(local_3a0._M_dataplus._M_p,
                                                  local_3a0.field_2._M_allocated_capacity + 1);
                                }
                                bVar16 = iVar17 == 0;
                                local_258 = p_Var1;
                                p_Stack_250 = p_Var26;
                                local_248 = iVar2._M_node;
                                goto LAB_0052b041;
                              }
                              if (this->Policy139Status == WARN) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_1a8);
                                cmPolicies::GetPolicyWarning_abi_cxx11_
                                          ((string *)local_358,(cmPolicies *)0x8b,id_00);
                                poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)local_1a8,(char *)local_358._0_8_,
                                                     local_358._8_8_);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          (poVar22,
                                           "\nPATH_EQUAL will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                                           ,0x89);
                                if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
                                  operator_delete((void *)local_358._0_8_,
                                                  (ulong)(local_358._16_8_ + 1));
                                }
                                pcVar3 = this->Makefile;
                                std::__cxx11::stringbuf::str();
                                cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,(string *)local_358);
                                goto LAB_0052b2d3;
                              }
                            }
                          }
                          goto LAB_0052ae2e;
                        }
                        local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
                        psVar20 = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
                        f2 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                       ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
                        SVar23 = cmsys::SystemTools::FileTimeCompare(psVar20,f2,(int *)local_1a8);
                        bVar16 = (uint)local_1a8._0_4_ < 2 || SVar23.Kind_ != Success;
                        local_240 = p_Var1;
                        p_Stack_238 = p_Var26;
                        local_230 = iVar2._M_node;
                      }
LAB_0052b041:
                      args_02.next._M_node = p_Var26;
                      args_02.current._M_node = p_Var1;
                      args_02.nextnext._M_node = iVar2._M_node;
                      cmArgumentList::ReduceTwoArgs(newArgs,bVar16,args_02);
                      goto LAB_0052ae2e;
                    }
                  }
                }
              }
            }
            cVar19 = GetDefinitionIfUnquoted(this,argument_00);
            if (cVar19.Value == (string *)0x0) {
              cVar19.Value = cmExpandedCommandArgument::GetValue_abi_cxx11_(argument_00);
            }
            cVar21 = GetDefinitionIfUnquoted(this,(cmExpandedCommandArgument *)(iVar2._M_node + 1));
            if (cVar21.Value == (string *)0x0) {
              cmExpandedCommandArgument::GetValue_abi_cxx11_
                        ((cmExpandedCommandArgument *)(iVar2._M_node + 1));
            }
            iVar18 = std::__cxx11::string::compare((string *)cVar19.Value);
            local_210 = p_Var1;
            p_Stack_208 = p_Var26;
            local_200 = iVar2._M_node;
            p_Var13 = local_1f8;
            p_Var14 = p_Stack_1f0;
            iVar15._M_node = local_1e8;
            if (iVar17 == 3) {
              bVar16 = 0 < iVar18;
            }
            else if (iVar17 == 2) {
              bVar16 = iVar18 < 1;
            }
            else if (iVar17 == 1) {
              bVar16 = SUB41((uint)iVar18 >> 0x1f,0);
            }
            else if (iVar17 == 4) {
              bVar16 = -1 < iVar18;
            }
            else {
              bVar16 = iVar17 == 5 && iVar18 == 0;
            }
          }
LAB_0052ae26:
          local_1e8 = iVar15._M_node;
          p_Stack_1f0 = p_Var14;
          local_1f8 = p_Var13;
          args_01.next._M_node = p_Var26;
          args_01.current._M_node = p_Var1;
          args_01.nextnext._M_node = iVar2._M_node;
          cmArgumentList::ReduceTwoArgs(newArgs,bVar16,args_01);
        }
      }
    }
LAB_0052ae2e:
    p_Var1 = p_Var1->_M_next;
    p_Var26 = p_Var1;
    if (p_Var1 != (_List_node_base *)newArgs) {
      p_Var26 = p_Var1->_M_next;
    }
    iVar2._M_node = p_Var26;
    if (p_Var26 != (_List_node_base *)newArgs) {
      iVar2._M_node = p_Var26->_M_next;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel2(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  for (auto args = newArgs.make3ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    int matchNo;

    // NOTE Handle special case `if(... BLAH_BLAH MATCHES)`
    // (i.e., w/o regex to match which is possibly result of
    // variable expansion to an empty string)
    if (args.next != newArgs.end() &&
        this->IsKeyword(keyMATCHES, *args.current)) {
      newArgs.ReduceOneArg(false, args);
    }

    // NOTE Fail fast: All the binary ops below require 2 arguments.
    else if (args.next == newArgs.end() || args.nextnext == newArgs.end()) {
      continue;
    }

    else if (this->IsKeyword(keyMATCHES, *args.next)) {
      cmValue def = this->GetDefinitionIfUnquoted(*args.current);

      std::string def_buf;
      if (!def) {
        def = cmValue(args.current->GetValue());
      } else if (cmHasLiteralPrefix(args.current->GetValue(),
                                    "CMAKE_MATCH_")) {
        // The string to match is owned by our match result variables.
        // Move it to our own buffer before clearing them.
        def_buf = *def;
        def = cmValue(def_buf);
      }

      this->Makefile.ClearMatches();

      const auto& rex = args.nextnext->GetValue();
      cmsys::RegularExpression regEntry;
      if (!regEntry.compile(rex)) {
        std::ostringstream error;
        error << "Regular expression \"" << rex << "\" cannot compile";
        errorString = error.str();
        status = MessageType::FATAL_ERROR;
        return false;
      }

      const auto match = regEntry.find(*def);
      if (match) {
        this->Makefile.StoreMatches(regEntry);
      }
      newArgs.ReduceTwoArgs(match, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyLESS, keyLESS_EQUAL, keyGREATER,
                                keyGREATER_EQUAL, keyEQUAL))) {

      cmValue ldef = this->GetVariableOrString(*args.current);
      cmValue rdef = this->GetVariableOrString(*args.nextnext);

      double lhs;
      double rhs;
      auto parseDoubles = [&]() {
        return std::sscanf(ldef->c_str(), "%lg", &lhs) == 1 &&
          std::sscanf(rdef->c_str(), "%lg", &rhs) == 1;
      };
      // clang-format off
      const auto result = parseDoubles() &&
        cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, lhs, rhs);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo = this->matchKeys(*args.next, keySTRLESS,
                                        keySTRLESS_EQUAL, keySTRGREATER,
                                        keySTRGREATER_EQUAL, keySTREQUAL))) {

      const cmValue lhs = this->GetVariableOrString(*args.current);
      const cmValue rhs = this->GetVariableOrString(*args.nextnext);
      const auto val = (*lhs).compare(*rhs);
      // clang-format off
      const auto result = cmRt2CtSelector<
            std::less, std::less_equal,
            std::greater, std::greater_equal,
            std::equal_to
          >::eval(matchNo, val, 0);
      // clang-format on
      newArgs.ReduceTwoArgs(result, args);
    }

    else if ((matchNo =
                this->matchKeys(*args.next, keyVERSION_LESS,
                                keyVERSION_LESS_EQUAL, keyVERSION_GREATER,
                                keyVERSION_GREATER_EQUAL, keyVERSION_EQUAL))) {
      const auto op = MATCH2CMPOP[matchNo - 1];
      const std::string& lhs = this->GetVariableOrString(*args.current);
      const std::string& rhs = this->GetVariableOrString(*args.nextnext);
      const auto result = cmSystemTools::VersionCompare(op, lhs, rhs);
      newArgs.ReduceTwoArgs(result, args);
    }

    // is file A newer than file B
    else if (this->IsKeyword(keyIS_NEWER_THAN, *args.next)) {
      auto fileIsNewer = 0;
      cmsys::Status ftcStatus = cmSystemTools::FileTimeCompare(
        args.current->GetValue(), args.nextnext->GetValue(), &fileIsNewer);
      newArgs.ReduceTwoArgs(
        (!ftcStatus || fileIsNewer == 1 || fileIsNewer == 0), args);
    }

    else if (this->IsKeyword(keyIN_LIST, *args.next)) {

      if (this->Policy57Status != cmPolicies::OLD &&
          this->Policy57Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->Makefile.GetDefinition(args.nextnext->GetValue());

        newArgs.ReduceTwoArgs(
          rhs && cm::contains(cmExpandedList(*rhs, true), *lhs), args);
      }

      else if (this->Policy57Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0057)
          << "\n"
             "IN_LIST will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }

    else if (this->IsKeyword(keyPATH_EQUAL, *args.next)) {

      if (this->Policy139Status != cmPolicies::OLD &&
          this->Policy139Status != cmPolicies::WARN) {

        cmValue lhs = this->GetVariableOrString(*args.current);
        cmValue rhs = this->GetVariableOrString(*args.nextnext);
        const auto result = cmCMakePath{ *lhs } == cmCMakePath{ *rhs };
        newArgs.ReduceTwoArgs(result, args);
      }

      else if (this->Policy139Status == cmPolicies::WARN) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0139)
          << "\n"
             "PATH_EQUAL will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    }
  }
  return true;
}